

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool __thiscall
google::protobuf::Reflection::IsFieldPresentGivenHasbits
          (Reflection *this,Message *message,FieldDescriptor *field,uint32_t *hasbits,
          uint32_t hasbit_index)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogMessage local_48;
  Voidify local_35;
  uint32_t local_34;
  uint32_t *puStack_30;
  uint32_t hasbit_index_local;
  uint32_t *hasbits_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_34 = hasbit_index;
  puStack_30 = hasbits;
  hasbits_local = (uint32_t *)field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = anon_unknown_6::IsIndexInHasBitSet(hasbits,hasbit_index);
  if (bVar1) {
    bVar1 = FieldDescriptor::has_presence((FieldDescriptor *)hasbits_local);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)hasbits_local);
      if (bVar1) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0xc3a,"!field->is_repeated()");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar2,(char (*) [47])"repeated fields do not have hasbits in proto3.");
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_35,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_48);
      }
      bVar1 = anon_unknown_6::IsMapEntry((FieldDescriptor *)hasbits_local);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ =
             IsSingularFieldNonEmpty(this,(Message *)field_local,(FieldDescriptor *)hasbits_local);
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Reflection::IsFieldPresentGivenHasbits(const Message& message,
                                            const FieldDescriptor* field,
                                            const uint32_t* hasbits,
                                            uint32_t hasbit_index) const {
  // If hasbit exists but is not set, field is guaranteed to be missing.
  if (!IsIndexInHasBitSet(hasbits, hasbit_index)) {
    return false;
  }

  // For explicit-presence fields, a set hasbit indicates a present field.
  if (field->has_presence()) {
    return true;
  }

  // proto3: hasbits are present, but an additional zero check must be
  // performed because hasbit can be set to true while field is zero.

  // Repeated fields do not have hasbits enabled in proto3.
  ABSL_DCHECK(!field->is_repeated())
      << "repeated fields do not have hasbits in proto3.";

  // Handling map entries in proto3:
  // Implicit presence map fields are represented as a native C++ map, but their
  // corresponding MapEntry messages (e.g. if we want to access them as repeated
  // MapEntry fields) will unconditionally be generated with hasbits. MapEntrys
  // behave like explicit presence fields. That is, in MapEntry's C++
  // implementation...
  // - key can be null, empty, or nonempty;
  // - value can be null, empty, or nonempty.
  if (IsMapEntry(field)) {
    return true;
  }

  // This is the vanilla case: for a non-repeated primitive or string field,
  // returns if the field is nonzero (i.e. present in proto3 semantics).
  return IsSingularFieldNonEmpty(message, field);
}